

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O2

uint quarticSolver(double *ce,double *roots)

{
  uint i_1;
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  uint i;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double ce2 [2];
  double croots [3];
  double cubic [3];
  
  dVar7 = *ce;
  dVar9 = dVar7 * 0.25;
  dVar8 = ce[1];
  dVar5 = dVar7 * dVar7 * -0.375 + dVar8;
  dVar6 = (dVar7 * dVar7 * 0.125 + dVar8 * -0.5) * dVar7 + ce[2];
  dVar7 = (dVar9 * dVar9 * -3.0 + dVar8) * dVar9 * dVar9 + (ce[3] - ce[2] * dVar9);
  std::operator<<((ostream *)&std::cout,"quarticSolver:: p=");
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar2,"\tq=");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"\tr=");
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (ABS(dVar6) <= 1e-75) {
    dVar7 = dVar5 * 0.25 * dVar5 - dVar7;
    if (dVar7 < 0.0) {
      return 0;
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = dVar5 * -0.5 - dVar7;
    dVar8 = -dVar5 - dVar7;
    if (dVar7 < 0.0) {
      if (0.0 <= dVar8) {
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        *roots = dVar8 - dVar9;
        roots[1] = -(dVar8 - dVar9) - dVar9;
        return 2;
      }
      return 0;
    }
    dVar6 = SQRT(dVar7);
    dVar5 = dVar6;
    if (dVar7 < 0.0) {
      dVar5 = sqrt(dVar7);
    }
    *roots = dVar5 - dVar9;
    if (dVar7 < 0.0) {
      dVar6 = sqrt(dVar7);
    }
    roots[1] = -dVar6 - dVar9;
    dVar5 = SQRT(dVar8);
    dVar7 = dVar5;
    if (dVar8 < 0.0) {
      dVar7 = sqrt(dVar8);
    }
    roots[2] = dVar7 - dVar9;
    if (dVar8 < 0.0) {
      dVar5 = sqrt(dVar8);
    }
    roots[3] = -dVar5 - dVar9;
  }
  else {
    if (ABS(dVar7) < 1e-75) {
      cubic[0] = 0.0;
      *roots = 0.0;
      cubic[1] = dVar5;
      cubic[2] = dVar6;
      uVar1 = cubicSolver(cubic,roots + 1);
      for (uVar3 = 0; uVar1 + 1 != uVar3; uVar3 = uVar3 + 1) {
        roots[uVar3] = roots[uVar3] - dVar9;
      }
      return uVar1 + 1;
    }
    cubic[0] = dVar5 + dVar5;
    cubic[1] = dVar5 * dVar5 + dVar7 * -4.0;
    cubic[2] = -dVar6 * dVar6;
    uVar1 = cubicSolver(cubic,croots);
    poVar2 = std::operator<<((ostream *)&std::cout,"quarticSolver:: real roots from cubic: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"cubic[");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"]=");
      poVar2 = std::ostream::_M_insert<double>(cubic[uVar3]);
      std::operator<<(poVar2," x= ");
      poVar2 = std::ostream::_M_insert<double>(croots[uVar3]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (uVar1 == 1) {
      if (0.0 <= croots[0]) {
        if (croots[0] < 0.0) {
          dVar7 = sqrt(croots[0]);
        }
        else {
          dVar7 = SQRT(croots[0]);
        }
        ce2[0] = -dVar7;
        dVar8 = (dVar6 * 0.5) / dVar7;
        ce2[1] = (croots[0] + dVar5) * 0.5 + dVar8;
        uVar1 = quadraticSolver(ce2,roots);
        if (uVar1 == 0) {
          ce2[1] = (croots[0] + dVar5) * 0.5 - dVar8;
          ce2[0] = dVar7;
          quadraticSolver(ce2,roots);
        }
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          roots[lVar4] = roots[lVar4] - dVar9;
        }
        return 2;
      }
      std::operator<<((ostream *)&std::cerr,
                      "Quartic Error:: Found one real root for cubic, but negative\n");
      return 0;
    }
    if (croots[0] <= 0.0) {
      return 0;
    }
    if (croots[1] <= 0.0) {
      return 0;
    }
    if (croots[0] < 0.0) {
      dVar7 = sqrt(croots[0]);
    }
    else {
      dVar7 = SQRT(croots[0]);
    }
    ce2[0] = -dVar7;
    dVar8 = (dVar6 * 0.5) / dVar7;
    dVar5 = (croots[0] + dVar5) * 0.5;
    ce2[1] = dVar5 + dVar8;
    quadraticSolver(ce2,roots);
    ce2[1] = dVar5 - dVar8;
    ce2[0] = dVar7;
    quadraticSolver(ce2,roots + 2);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      roots[lVar4] = roots[lVar4] - dVar9;
    }
  }
  return 4;
}

Assistant:

unsigned int quarticSolver(double * ce, double *roots)
//quartic solver
// x^4 + ce[0] x^3 + ce[1] x^2 + ce[2] x + ce[3] = 0
{
    // x^4 + a x^3 + b x^2 +c x + d = 0
    // depressed quartic, x= t - a/4
    // t^4 + ( b - 3/8 a^2 ) t^2 + (c - a b/2 + a^3/8) t + d - a c /4 + a^2 b/16 - 3 a^4/256 =0
    // t^4 + p t^2 + q t + r =0
    // p= b - (3./8)*a*a;
    // q= c - 0.5*a*b+(1./8)*a*a*a;
    // r= d - 0.25*a*c+(1./16)*a*a*b-(3./256)*a^4
    unsigned int ret=0;
    double shift=0.25*ce[0];
    double shift2=shift*shift;
    double a2=ce[0]*ce[0];
    double p= ce[1] - (3./8)*a2;
    double q= ce[2] + ce[0]*((1./8)*a2 - 0.5*ce[1]);
    double r= ce[3] - shift*ce[2] + (ce[1] - 3.*shift2)*shift2;
    std::cout<<"quarticSolver:: p="<<p<<"\tq="<<q<<"\tr="<<r<<std::endl;
    if (fabs(q) <= 1.0e-75) {// Biquadratic equations
        double discriminant= 0.25*p*p -r;
        if (discriminant < 0.) {
            return 0;
        }
        double t2[2];
        t2[0]=-0.5*p-sqrt(discriminant);
        t2[1]= -p - t2[0];
        if ( t2[0] >= 0. ) {// four real roots
            roots[0]=sqrt(t2[0])-shift;
            roots[1]= -sqrt(t2[0])-shift;
            roots[2]=sqrt(t2[1])-shift;
            roots[3]= -sqrt(t2[1])-shift;
            return 4;
        }
        if ( t2[1] >= 0.) { // two real roots
            roots[0]=sqrt(t2[1])-shift;
            roots[1]= -roots[0]-shift;
            return 2;
        }
        return 0;
    }
    if ( fabs(r)< 1.0e-75 ) {
        double cubic[3]= {0.,p,q};
        roots[0]=0.;
        ret=1+cubicSolver(cubic,roots+1);
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    // depressed quartic to two quadratic equations
    // t^4 + p t^2 + q t + r = ( t^2 + u t + v) ( t^2 - u t + w)
    // so,
    // 	p + u^2= w+v
    // 	q/u= w-v
    // 	r= wv
    // so,
    //  (p+u^2)^2 - (q/u)^2 = 4 r
    //  y=u^2,
    //  y^3 + 2 p y^2 + ( p^2 - 4 r) y - q^2 =0
    //
    double cubic[3]= {2.*p,p*p-4.*r,-q*q},croots[3];
    ret = cubicSolver(cubic,croots);
    std::cout<<"quarticSolver:: real roots from cubic: "<<ret<<std::endl;
    for(unsigned int i=0; i<ret; i++)
        std::cout<<"cubic["<<i<<"]="<<cubic[i]<<" x= "<<croots[i]<<std::endl;
    if (ret==1) { //one real root from cubic
        if (croots[0]< 0.) {//this should not happen
            std::cerr<<"Quartic Error:: Found one real root for cubic, but negative\n";
            return 0;
        }
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        if (! ret ) {
            ce2[0]=	sqrtz0;
            ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
            ret=quadraticSolver(ce2,roots);
        }
        ret=2;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    if ( croots[0]> 0. && croots[1] > 0. ) {
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        ce2[0]=	sqrtz0;
        ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots+2);
        ret=4;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    return 0;



}